

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O3

Var Js::AtomicsObject::EntryWait(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  BOOL BVar6;
  uint32 uVar7;
  uint uVar8;
  int iVar9;
  undefined4 *puVar10;
  Var pvVar11;
  Var requestIndex;
  TypedArrayBase *pTVar12;
  undefined4 extraout_var;
  WaiterList *this;
  uint extraout_var_00;
  SharedArrayBuffer *this_00;
  StaticType *pSVar13;
  charcount_t charLength;
  char16_t *content;
  uint index;
  double value;
  int in_stack_00000010;
  CallInfo local_68;
  CallInfo callInfo_local;
  ArgumentReader args;
  uint32 local_44;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_68 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xb4,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b25341;
    *puVar10 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_68);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_68 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xb4,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00b25341;
    *puVar10 = 0;
  }
  if (((ulong)callInfo_local & 0xfffffc) == 0) {
    JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec12,L"Atomics.wait");
  }
  pvVar11 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  requestIndex = Arguments::operator[]((Arguments *)&callInfo_local,2);
  ValidateSharedIntegerTypedArray(pvVar11,pSVar1,true);
  uVar5 = ValidateAtomicAccess(pvVar11,requestIndex,pSVar1);
  pTVar12 = VarTo<Js::TypedArrayBase>(pvVar11);
  args.super_Arguments.Values = (Type)Arguments::operator[]((Arguments *)&callInfo_local,3);
  if (((ulong)args.super_Arguments.Values & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)args.super_Arguments.Values & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)args.super_Arguments.Values & 0xffff000000000000) == 0x1000000000000)
    goto LAB_00b24e41;
    uVar8 = JavascriptConversion::ToInt32_Full(args.super_Arguments.Values,pSVar1);
    args.super_Arguments.Values = (Type)(ulong)uVar8;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00b25341;
    *puVar10 = 0;
LAB_00b24e41:
    if (((ulong)args.super_Arguments.Values & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00b25341;
      *puVar10 = 0;
    }
  }
  local_44 = 0xffffffff;
  if (4 < (callInfo_local._0_4_ & 0xffffff)) {
    pvVar11 = Arguments::operator[]((Arguments *)&callInfo_local,4);
    BVar6 = JavascriptOperators::IsUndefinedObject(pvVar11);
    if (BVar6 == 0) {
      pvVar11 = Arguments::operator[]((Arguments *)&callInfo_local,4);
      if (((ulong)pvVar11 & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)pvVar11 & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)pvVar11 & 0xffff000000000000) == 0x1000000000000) goto LAB_00b24f80;
        if ((ulong)pvVar11 >> 0x32 == 0) {
          value = JavascriptConversion::ToNumber_Full(pvVar11,pSVar1);
        }
        else {
          value = (double)((ulong)pvVar11 ^ 0xfffc000000000000);
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar4) goto LAB_00b25341;
        *puVar10 = 0;
LAB_00b24f80:
        value = (double)(int)pvVar11;
      }
      bVar4 = NumberUtilities::IsNan(value);
      if ((!bVar4) && (bVar4 = NumberUtilities::IsSpecial(value,0x7ff0000000000000), !bVar4)) {
        uVar7 = JavascriptConversion::ToInt32(value);
        local_44 = 0;
        if (0 < (int)uVar7) {
          local_44 = uVar7;
        }
      }
    }
  }
  bVar4 = AgentOfBuffer::AgentCanSuspend(pSVar1);
  if (!bVar4) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e9df,(PCWSTR)0x0);
  }
  if (pTVar12->BYTES_PER_ELEMENT != 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xcb,"(typedArrayBase->GetBytesPerElement() == 4)",
                                "typedArrayBase->GetBytesPerElement() == 4");
    if (!bVar4) goto LAB_00b25341;
    *puVar10 = 0;
  }
  index = uVar5 * 4 + pTVar12->byteOffset;
  uVar8 = (*(((pTVar12->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if (uVar8 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xcd,
                                "(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength())",
                                "bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength()");
    if (!bVar4) goto LAB_00b25341;
    *puVar10 = 0;
  }
  iVar9 = (*(((pTVar12->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x6f])();
  this_00 = (SharedArrayBuffer *)CONCAT44(extraout_var,iVar9);
  this = SharedArrayBuffer::GetWaiterList(this_00,index);
  CCLock::Enter(&(this->csForAccess).super_CCLock);
  iVar9 = (*(pTVar12->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x72])(pTVar12,(ulong)uVar5);
  pvVar11 = (Var)CONCAT44(extraout_var_00,iVar9);
  if ((extraout_var_00 & 0x1ffff) == 0x10000 || (extraout_var_00 & 0xffff0000) != 0x10000) {
    if ((extraout_var_00 & 0xffff0000) == 0x10000) goto LAB_00b25172;
    uVar8 = JavascriptConversion::ToInt32_Full(pvVar11,pSVar1);
    pvVar11 = (Var)(ulong)uVar8;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00b25341;
    *puVar10 = 0;
LAB_00b25172:
    if ((extraout_var_00 & 0x1ffff) != 0x10000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00b25341;
      *puVar10 = 0;
    }
  }
  if ((int)args.super_Arguments.Values == (int)pvVar11) {
    bVar4 = SharedContents::IsValidAgent(this_00->sharedContents,(DWORD_PTR)pSVar1);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      this_00 = (SharedArrayBuffer *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)
       &(this_00->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                  ,0xde,
                                  "(sharedArrayBuffer->GetSharedContents()->IsValidAgent(agent))",
                                  "sharedArrayBuffer->GetSharedContents()->IsValidAgent(agent)");
      if (!bVar4) {
LAB_00b25341:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *(undefined4 *)
       &(this_00->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
    }
    bVar4 = WaiterList::AddAndSuspendWaiter(this,(DWORD_PTR)pSVar1,local_44);
    if (bVar4) {
      bVar4 = true;
    }
    else {
      WaiterList::RemoveWaiter(this,(DWORD_PTR)pSVar1);
      bVar4 = false;
    }
  }
  else {
    pJVar2 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
    pSVar13 = StringCache::GetStringTypeStatic(&pJVar2->stringCache);
    this_00 = (SharedArrayBuffer *)LiteralString::New(pSVar13,L"not-equal",9,pJVar2->recycler);
    bVar4 = false;
  }
  CCLock::Leave(&(this->csForAccess).super_CCLock);
  if ((int)args.super_Arguments.Values == (int)pvVar11) {
    pJVar2 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
    pSVar13 = StringCache::GetStringTypeStatic(&pJVar2->stringCache);
    if (bVar4) {
      content = L"ok";
      charLength = 2;
    }
    else {
      content = L"timed-out";
      charLength = 9;
    }
    this_00 = (SharedArrayBuffer *)LiteralString::New(pSVar13,content,charLength,pJVar2->recycler);
  }
  return this_00;
}

Assistant:

Var AtomicsObject::EntryWait(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ATOMICS_FUNCTION_ENTRY_CHECKS(3, "Atomics.wait");

        uint32 accessIndex = 0;
        TypedArrayBase *typedArrayBase = ValidateAndGetTypedArray(args[1], args[2], &accessIndex, scriptContext, true /*onlyInt32*/);

        int32 value = JavascriptConversion::ToInt32(args[3], scriptContext);
        uint32 timeout = INFINITE;

        if (args.Info.Count > 4 && !JavascriptOperators::IsUndefinedObject(args[4]))
        {
            double t =JavascriptConversion::ToNumber(args[4], scriptContext);
            if (!(NumberUtilities::IsNan(t) || JavascriptNumber::IsPosInf(t)))
            {
                int32 t1 = JavascriptConversion::ToInt32(t);
                timeout = (uint32)max(0, t1);
            }
        }

        if (!AgentOfBuffer::AgentCanSuspend(scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_CannotSuspendBuffer);
        }

        Assert(typedArrayBase->GetBytesPerElement() == 4);
        uint32 bufferIndex = (accessIndex * 4) + typedArrayBase->GetByteOffset();
        Assert(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength());
        SharedArrayBuffer *sharedArrayBuffer = typedArrayBase->GetArrayBuffer()->GetAsSharedArrayBuffer();
        WaiterList *waiterList = sharedArrayBuffer->GetWaiterList(bufferIndex);


        bool awoken = false;

        {
            AutoCriticalSection autoCS(waiterList->GetCriticalSectionForAccess());

            int32 w = JavascriptConversion::ToInt32(typedArrayBase->DirectGetItem(accessIndex), scriptContext);
            if (value != w)
            {
                return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("not-equal"));
            }

            DWORD_PTR agent = (DWORD_PTR)scriptContext;
            Assert(sharedArrayBuffer->GetSharedContents()->IsValidAgent(agent));
#pragma prefast(suppress:__WARNING_CALLER_FAILING_TO_HOLD, "This is a prefast false-positive caused by it being unable to identify that the critical section used here is the same as the one held by the AutoCriticalSection")
            awoken = waiterList->AddAndSuspendWaiter(agent, timeout);
            if (!awoken)
            {
                waiterList->RemoveWaiter(agent);
            }
        }

        return awoken ? scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("ok"))
            : scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("timed-out"));
    }